

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_size nVar1;
  double dVar2;
  undefined1 auVar3 [16];
  nk_draw_vertex_layout_attribute nVar4;
  nk_color nVar5;
  uint uVar6;
  ulong uVar7;
  nk_draw_vertex_layout_format value_count;
  nk_size length;
  float *src0;
  nk_vec2 *values;
  nk_draw_vertex_layout_format *pnVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  nk_uint col [4];
  float val [4];
  undefined8 local_118;
  double local_110;
  double local_108;
  double local_100;
  int local_f0;
  int local_ec;
  int local_e8;
  uint local_e4;
  long local_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [4];
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  nk_size local_60;
  nk_vec2 local_58;
  nk_vec2 local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_60 = config->vertex_size;
  nVar4 = config->vertex_layout->attribute;
  if (nVar4 != NK_VERTEX_ATTRIBUTE_COUNT) {
    fVar10 = color.r;
    fVar9 = (float)(-(uint)(1.0 < fVar10) & 0x3f800000 |
                   ~-(uint)(1.0 < fVar10) & -(uint)(0.0 < fVar10) & 0x3f800000);
    fVar11 = color.g;
    fStack_b0 = color.r;
    fStack_ac = color.g;
    local_b8 = (undefined1  [4])fVar10;
    fStack_b4 = fVar11;
    if (fVar10 <= 0.0) {
      fStack_b4 = 0.0;
      fStack_b0 = 0.0;
      fStack_ac = 0.0;
      local_b8 = (undefined1  [4])fVar9;
    }
    auVar3 = ZEXT416((uint)fVar9);
    if (fVar10 <= 1.0) {
      auVar3 = _local_b8;
    }
    _local_b8 = auVar3;
    fVar9 = (float)(-(uint)(1.0 < fVar11) & 0x3f800000 |
                   ~-(uint)(1.0 < fVar11) & -(uint)(0.0 < fVar11) & 0x3f800000);
    local_c8._0_4_ = fVar11;
    fStack_bc = fVar11;
    if (fVar11 <= 0.0) {
      fStack_bc = 0.0;
      local_c8._0_4_ = fVar9;
    }
    auVar3 = ZEXT416((uint)fVar9);
    if (fVar11 <= 1.0) {
      local_c8._4_4_ = fStack_bc;
      fStack_c0 = fStack_bc;
      auVar3 = _local_c8;
    }
    _local_c8 = auVar3;
    fVar11 = color.b;
    local_98 = (float)(-(uint)(1.0 < fVar11) & 0x3f800000 |
                      ~-(uint)(1.0 < fVar11) & -(uint)(0.0 < fVar11) & 0x3f800000);
    fVar12 = color.a;
    fVar9 = fVar11;
    fVar10 = fVar12;
    if (fVar11 <= 0.0) {
      fVar9 = local_98;
      fVar10 = 0.0;
      in_XMM3_Dc = 0;
      in_XMM3_Dd = 0;
    }
    fStack_94 = 0.0;
    uStack_90 = 0;
    uStack_8c = 0;
    if (fVar11 <= 1.0) {
      local_98 = fVar9;
      fStack_94 = fVar10;
      uStack_90 = in_XMM3_Dc;
      uStack_8c = in_XMM3_Dd;
    }
    local_48 = (float)(-(uint)(1.0 < fVar12) & 0x3f800000 |
                      ~-(uint)(1.0 < fVar12) & -(uint)(0.0 < fVar12) & 0x3f800000);
    fVar9 = fVar12;
    fVar10 = fVar12;
    if (fVar12 <= 0.0) {
      fVar9 = local_48;
      fVar10 = 0.0;
    }
    fStack_44 = 0.0;
    if (fVar12 <= 1.0) {
      local_48 = fVar9;
      fStack_44 = fVar10;
    }
    local_68 = (double)(float)local_b8;
    local_70 = (double)(float)local_c8._0_4_;
    local_78 = (double)local_98;
    local_80 = (double)local_48;
    local_d0 = (long)((float)local_b8 * 4.2949673e+09);
    local_d8 = (long)((float)local_c8._0_4_ * 4.2949673e+09);
    local_e0 = (long)(local_98 * 4.2949673e+09);
    local_88 = (long)(local_48 * 4.2949673e+09);
    local_e8 = (int)((float)local_b8 * 65535.0);
    local_ec = (int)((float)local_c8._0_4_ * 65535.0);
    local_f0 = (int)(local_98 * 65535.0);
    local_e4 = (uint)(local_48 * 65535.0);
    uVar7 = (ulong)local_e4;
    pnVar8 = &config->vertex_layout->format;
    local_58 = uv;
    local_50 = pos;
    fStack_40 = fStack_44;
    fStack_3c = fStack_44;
    do {
      fVar11 = local_9c;
      fVar10 = local_a4;
      fVar9 = local_a8;
      dVar2 = local_118;
      if (*pnVar8 == NK_FORMAT_COUNT) break;
      nVar1 = *(nk_size *)(pnVar8 + 1);
      if (nVar4 == NK_VERTEX_POSITION) {
        value_count = *pnVar8;
        values = &local_50;
LAB_001219f6:
        nk_draw_vertex_element
                  ((void *)(nVar1 + (long)dst),&values->x,value_count,
                   (nk_draw_vertex_layout_format)uVar7);
        goto LAB_001219fb;
      }
      if (nVar4 != NK_VERTEX_COLOR) {
        if (nVar4 != NK_VERTEX_TEXCOORD) {
          __assert_fail("0 && \"wrong element attribute\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x2537,
                        "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                       );
        }
        value_count = *pnVar8;
        values = &local_58;
        goto LAB_001219f6;
      }
      if (*pnVar8 < NK_FORMAT_COLOR_BEGIN) {
        __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x24b2,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      local_a8 = (float)local_b8;
      local_a4 = (float)local_c8._0_4_;
      local_9c = local_48;
      switch(*pnVar8) {
      case NK_FORMAT_COLOR_BEGIN:
      case NK_FORMAT_R8G8B8A8:
      case NK_FORMAT_RGB32:
      case NK_FORMAT_COLOR_END:
        local_a0 = local_98;
        nVar5 = nk_rgba_f((float)local_b8,(float)local_c8._0_4_,local_98,local_48);
        goto LAB_001219d7;
      case NK_FORMAT_R16G15B16:
        local_118._0_4_ = (float)CONCAT22((short)local_ec,(short)local_e8);
        local_118._6_2_ = SUB82(dVar2,6);
        local_118._0_6_ = CONCAT24((short)local_f0,(float)local_118);
        length = 6;
        src0 = (float *)&local_118;
        local_a0 = local_98;
        break;
      case NK_FORMAT_R32G32B32:
        local_118 = (double)CONCAT44((int)local_d8,(int)local_d0);
        local_110 = (double)CONCAT44(local_110._4_4_,(int)local_e0);
        length = 0xc;
        src0 = (float *)&local_118;
        local_a0 = local_98;
        break;
      case NK_FORMAT_B8G8R8A8:
        local_a0 = local_98;
        nVar5 = nk_rgba_f((float)local_b8,(float)local_c8._0_4_,local_98,local_48);
        uVar6 = (uint)nVar5 >> 0x10 & 0xff;
        uVar7 = (ulong)uVar6;
        nVar5 = (nk_color)((uint)nVar5 & 0xff00ff00 | ((uint)nVar5 & 0xff) << 0x10 | uVar6);
LAB_001219d7:
        local_118 = (double)CONCAT44(local_118._4_4_,nVar5);
        length = 4;
        src0 = (float *)&local_118;
        break;
      case NK_FORMAT_R16G15B16A16:
        local_118._0_4_ = (float)CONCAT22((short)local_ec,(short)local_e8);
        local_118._0_6_ = CONCAT24((short)local_f0,(float)local_118);
        local_118 = (double)CONCAT26((short)local_e4,(undefined6)local_118);
        length = 8;
        src0 = (float *)&local_118;
        local_a0 = local_98;
        break;
      case NK_FORMAT_R32G32B32A32:
        local_118 = (double)CONCAT44((int)local_d8,(int)local_d0);
        local_110 = (double)CONCAT44((int)local_88,(int)local_e0);
        length = 0x10;
        src0 = (float *)&local_118;
        local_a0 = local_98;
        break;
      case NK_FORMAT_R32G32B32A32_FLOAT:
        length = 0x10;
        src0 = &local_a8;
        local_a0 = local_98;
        break;
      case NK_FORMAT_R32G32B32A32_DOUBLE:
        local_118 = local_68;
        local_110 = local_70;
        local_108 = local_78;
        local_100 = local_80;
        length = 0x20;
        src0 = (float *)&local_118;
        local_a0 = local_98;
        break;
      default:
        local_a8 = fVar9;
        local_a4 = fVar10;
        local_9c = fVar11;
        __assert_fail("format <= NK_FORMAT_COLOR_END",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x24b3,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      nk_memcopy((void *)(nVar1 + (long)dst),src0,length);
LAB_001219fb:
      nVar4 = pnVar8[3];
      pnVar8 = pnVar8 + 4;
    } while (nVar4 != NK_VERTEX_ATTRIBUTE_COUNT);
  }
  return (void *)((long)dst + local_60);
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute"); break;
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}